

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyplayer.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  FILE *pFVar8;
  size_t __size;
  uchar *__ptr;
  size_t sVar9;
  undefined8 uVar10;
  char *pcVar11;
  FILE *__stream;
  double dVar12;
  char *local_ac0;
  uint local_ab4;
  uint8_t *converted;
  ssbase base;
  
  puts("Farbrausch Tiny Music Player v0.dontcare TWO");
  puts("Code and Synthesizer (C) 2000-2008 kb/Farbrausch");
  printf("Version: %s\n","0.20250301");
  printf("SDL Port by %s\n\n","https://github.com/jgilje/v2m-player");
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
switchD_00101408_caseD_69:
  do {
    iVar5 = getopt(argc,argv,"ko:hs:g:f:");
    pFVar8 = _stdin;
    switch(iVar5) {
    case 0x66:
      frame_size = atoi(_optarg);
      if (0x3fff < frame_size) {
        frame_size = 0x4000;
      }
      if (frame_size < 0x41) {
        frame_size = 0x40;
      }
      goto switchD_00101408_caseD_69;
    case 0x67:
      dVar12 = atof(_optarg);
      gain = (float)dVar12;
      goto switchD_00101408_caseD_69;
    case 0x68:
      bVar1 = true;
    case 0x69:
    case 0x6a:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x70:
    case 0x71:
    case 0x72:
      goto switchD_00101408_caseD_69;
    case 0x6b:
      bVar3 = true;
      goto switchD_00101408_caseD_69;
    case 0x6f:
      local_ac0 = _optarg;
      bVar2 = true;
      goto switchD_00101408_caseD_69;
    case 0x73:
      atof(_optarg);
      goto switchD_00101408_caseD_69;
    }
    if (iVar5 == 0x3a) {
      puts("option needs a value");
      goto switchD_00101408_caseD_69;
    }
    if (iVar5 == 0x3f) {
      printf("unknown option: %c\n",(ulong)_optopt);
      goto switchD_00101408_caseD_69;
    }
  } while (iVar5 != -1);
  if (bVar1 || argc <= _optind) {
    puts("Usage : v2mplayer [options] input_file_v2m | - (stdin)\n");
    puts("options:");
    puts("          -s N.N  start at position (float, optional, in s., default = 0.0)");
    puts("          -g N.N  gain (float, optional, default = 1.0)");
    puts("          -f N    frame size for SDL (int, optional, default = 1024)");
    puts("          -k      key/auto stop (bool, optional, default = false)");
    puts("          -o str  output v2m newest version (string, optional, default = none)");
    puts("          -h      this help");
    return 1;
  }
  pcVar11 = argv[_optind];
  if ((*pcVar11 == '-') && (pcVar11[1] == '\0')) {
    __size = 0x1000;
    __ptr = (uchar *)calloc(1,0x1000);
    if (__ptr != (uchar *)0x0) {
      sVar9 = 0;
      uVar7 = 0;
      __stream = pFVar8;
      while( true ) {
        uVar6 = getc(__stream);
        if (0xfff < uVar7 && (uVar6 & 0xff) == 0xff) break;
        uVar7 = uVar7 + 1;
        if ((uVar6 & 0xff) != 0xff) {
          uVar7 = 0;
        }
        if (__size == sVar9) {
          __size = __size + 0x1000;
          __ptr = (uchar *)realloc(__ptr,__size);
          if (__ptr == (uchar *)0x0) {
            pcVar11 = "Error memory allocator: %lu b\n";
            goto LAB_001019ad;
          }
        }
        __ptr[sVar9] = (uchar)uVar6;
        sVar9 = (size_t)((int)sVar9 + 1);
        __stream = _stdin;
      }
      uVar7 = (int)sVar9 - uVar7;
      printf("Now Playing: stdin(%d[%lu])\n",(ulong)uVar7,__size);
LAB_001016cb:
      fclose(pFVar8);
      sdInit();
      if ((__ptr[2] == '\0') && (__ptr[3] == '\0')) {
        iVar5 = CheckV2MVersion(__ptr,uVar7,&base);
        if (iVar5 < 0) {
          pcVar11 = "Failed to Check Version on input file";
          goto LAB_00101971;
        }
        ConvertV2M(__ptr,uVar7,&converted,(int *)&local_ab4);
        free(__ptr);
        if (converted != (uint8_t *)0x0) {
          printf("Convert: %d b\n",(ulong)local_ab4);
          do {
            uVar7 = local_ab4;
            local_ab4 = uVar7 - 1;
          } while (converted[uVar7] == '\0');
          printf("Strip: %d b\n");
          if (bVar2) {
            pFVar8 = fopen(local_ac0,"a");
            pcVar11 = local_ac0;
            if (pFVar8 == (FILE *)0x0) {
LAB_00101932:
              fprintf(_stderr,"Failed to open %s\n",pcVar11);
              return 1;
            }
            fwrite(converted,1,(ulong)(uVar7 + 1),pFVar8);
            fclose(pFVar8);
          }
          player.m_tpc = 1000;
          memset(&player.m_base,0,0x1240);
          V2MPlayer::Open(&player,(uint)converted);
          iVar5 = SDL_Init(0x10);
          if (iVar5 < 0) {
            uVar10 = SDL_GetError();
            SDL_Log("Couldn\'t initialize SDL: %s\n",uVar10);
            SDL_Quit();
            return 1;
          }
          base.patchmap._6_1_ = 2;
          base.patchmap._0_4_ = 0xac44;
          base.globals._0_2_ = (undefined2)frame_size;
          base.patchmap._4_2_ = 0x8120;
          base._16_8_ = sdl_callback;
          iVar5 = SDL_OpenAudioDevice(0,0,&base,&converted,0);
          if (iVar5 == 0) {
            uVar10 = SDL_GetError();
            SDL_Log("Failed to open audio, %s\n",uVar10);
            return 1;
          }
          V2MPlayer::Play(0x104150);
          SDL_PauseAudioDevice(iVar5,0);
          uVar7 = V2MPlayer::Length();
          printf("Length: %d\n",(ulong)uVar7);
          if (bVar3) {
            puts("\n\npress Enter to quit");
            getc(_stdin);
          }
          else {
            while (cVar4 = V2MPlayer::IsPlaying(), cVar4 != '\0') {
              sleep(1);
            }
          }
          SDL_PauseAudioDevice(iVar5,1);
          SDL_Quit();
          V2MPlayer::Close();
          free(converted);
          return 0;
        }
      }
      else {
        pcVar11 = "No valid input file";
LAB_00101971:
        SDL_LogCritical(7,pcVar11);
      }
      fwrite("Error convert to newest\n",0x18,1,_stderr);
      goto LAB_001019b4;
    }
    pcVar11 = "Error memory allocator: %Ld b\n";
    __size = 0x1000;
  }
  else {
    pFVar8 = fopen(pcVar11,"rb");
    if (pFVar8 == (FILE *)0x0) goto LAB_00101932;
    fseek(pFVar8,0,2);
    __size = ftell(pFVar8);
    fseek(pFVar8,0,0);
    printf("Now Playing: %s\n",pcVar11);
    __ptr = (uchar *)calloc(1,__size);
    if (__ptr != (uchar *)0x0) {
      sVar9 = fread(__ptr,1,__size,pFVar8);
      uVar7 = (uint)sVar9;
      if (__size != (sVar9 & 0xffffffff)) {
        fwrite("Invalid read size\n",0x12,1,_stderr);
        return 1;
      }
      goto LAB_001016cb;
    }
    pcVar11 = "Error memory allocator: %Ld b\n";
  }
LAB_001019ad:
  fprintf(_stderr,pcVar11,__size);
LAB_001019b4:
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    V2mPlayerTitle();
    int opt;
    int startPos = 0;
    int fouts = 0;
    int fkey = 0;
    int fhelp = 0;
    char *foutput;
    while ((opt = getopt(argc, argv, "ko:hs:g:f:")) != -1)
    {
        switch(opt)
        {
            case 'k':
                fkey = 1;
                break;
            case 'o':
                foutput = optarg;
                fouts = 1;
                break;
            case 'h':
                fhelp = 1;
                break;
            case 'g':
                gain = atof(optarg);
                break;
            case 'f':
                frame_size = atoi(optarg);
                frame_size = (frame_size < 64) ? 64 : ((frame_size < 16384) ? frame_size : 16384);
                break;
            case 's':
                startPos = (int)(atof(optarg) * 1000);
                startPos = (startPos < 0) ? 0 : startPos;
                break;
            case ':':
                printf("option needs a value\n");
                break;
            case '?':
                printf("unknown option: %c\n", optopt);
                break;
        }
    }

    if((fhelp > 0)||(optind + 1 > argc))
    {
        V2mPlayerUsage();
        return 1;
    }
    unsigned char* theTune;
    FILE* file;
    uint64_t size;
    unsigned int blksz = 4096, read = 0, eofcnt = 0;
    char ch;
    const char *v2m_filename = argv[optind];
    if (strcmp(v2m_filename, "-") == 0)
    {
        file = stdin;
        eofcnt = 0;
        size = blksz;
        theTune = (unsigned char*) calloc(1, size);
        if (theTune == NULL)
        {
            fprintf(stderr, "Error memory allocator: %Ld b\n", size);
            exit(1);
        }
        ch = getc(stdin);
        while (ch != EOF || eofcnt < blksz)
        {
            if (ch != EOF) {eofcnt = 0;} else {eofcnt++;}
            if (read == size)
            {
                size += blksz;
                theTune = (unsigned char*)realloc(theTune, size * sizeof(unsigned char));
                if (theTune == NULL)
                {
                    fprintf(stderr, "Error memory allocator: %lu b\n", size);
                    exit(1);
                }
            }
            theTune[read] = ch;
            read++;
            ch = getc(stdin);
        }
        read -= eofcnt;

        printf("Now Playing: stdin(%d[%lu])\n", read, size);
        size = read;
    } else {
        file = fopen(v2m_filename, "rb");
        if (file == NULL)
        {
            fprintf(stderr, "Failed to open %s\n", v2m_filename);
            return 1;
        }

        fseek(file, 0, SEEK_END);
        size = ftell(file);
        fseek(file, 0, SEEK_SET);
        printf("Now Playing: %s\n", v2m_filename);
        theTune = (unsigned char*) calloc(1, size);
        if (theTune == NULL)
        {
            fprintf(stderr, "Error memory allocator: %Ld b\n", size);
            exit(1);
        }
        read = fread(theTune, 1, size, file);
    }
    if (size != read)
    {
        fprintf(stderr, "Invalid read size\n");
        return 1;
    }
    fclose(file);
    theTune = check_and_convert(theTune, &read);
    if (theTune == NULL)
    {
        fprintf(stderr, "Error convert to newest\n");
        exit(1);
    }
    printf("Convert: %d b\n", read);
    while (theTune[read--] == 0){}
    read++;
    read++;
    printf("Strip: %d b\n", read);

    if (fouts)
    {
        FILE* fout;
        fout = fopen(foutput, "a");
        if (fout == NULL)
        {
            fprintf(stderr, "Failed to open %s\n", foutput);
            return 1;
        }
        fwrite(theTune, 1, read, fout);
        fclose(fout);
    }

    player.Init();
    player.Open(theTune);

    if (! init_sdl()) {
        return 1;
    }

    player.Play(startPos);
    SDL_PauseAudioDevice(dev, 0);

    printf("Length: %d\n", player.Length());
    if (fkey > 0)
    {
        printf("\n\npress Enter to quit\n");
        getc(stdin);
    } else {
        while(player.IsPlaying()) { sleep(1); }
    }

    SDL_PauseAudioDevice(dev, 1);
    SDL_Quit();
    player.Close();
    free(theTune);
    return 0;
}